

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O2

TransformationType __thiscall QTransform::type(QTransform *this)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar2 = *(ushort *)&this->field_0x48;
  uVar4 = uVar2 >> 5 & 0x1f;
  uVar3 = uVar2 & 0x1f;
  if (uVar4 < uVar3 || (uVar2 >> 5 & 0x1f) == 0) goto LAB_003dc5b1;
  switch(uVar4) {
  case 1:
switchD_003dc365_caseD_1:
    dVar6 = this->m_matrix[2][0];
    uVar5 = -(ulong)(dVar6 < -dVar6);
    if ((1e-12 < (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5)) ||
       (dVar6 = this->m_matrix[2][1], uVar5 = -(ulong)(dVar6 < -dVar6),
       1e-12 < (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5))) {
      uVar2 = (uVar2 & 0xffe0) + 1;
    }
    else {
      uVar2 = uVar2 & 0xffe0;
    }
    break;
  case 2:
switchD_003dc365_caseD_2:
    dVar6 = this->m_matrix[0][0] + -1.0;
    uVar5 = -(ulong)(dVar6 < -dVar6);
    if (((double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12) &&
       (dVar6 = this->m_matrix[1][1] + -1.0, uVar5 = -(ulong)(dVar6 < -dVar6),
       (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12))
    goto switchD_003dc365_caseD_1;
    uVar2 = uVar2 & 0xffe0 | 2;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
  case 8:
switchD_003dc365_caseD_4:
    dVar6 = this->m_matrix[0][1];
    dVar1 = this->m_matrix[1][0];
    uVar5 = -(ulong)(dVar6 < -dVar6);
    if (((double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12) &&
       (uVar5 = -(ulong)(dVar1 < -dVar1),
       (double)(~uVar5 & (ulong)dVar1 | (ulong)-dVar1 & uVar5) <= 1e-12))
    goto switchD_003dc365_caseD_2;
    dVar6 = dVar1 * this->m_matrix[0][0] + dVar6 * this->m_matrix[1][1];
    uVar5 = -(ulong)(dVar6 < -dVar6);
    uVar2 = (uVar2 & 0xffe0) +
            (ushort)(1e-12 < (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5)) * 4 + 4;
    break;
  default:
    if (uVar4 == 0x10) {
      dVar6 = this->m_matrix[0][2];
      uVar5 = -(ulong)(dVar6 < -dVar6);
      if ((((double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12) &&
          (dVar6 = this->m_matrix[1][2], uVar5 = -(ulong)(dVar6 < -dVar6),
          (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12)) &&
         (dVar6 = this->m_matrix[2][2] + -1.0, uVar5 = -(ulong)(dVar6 < -dVar6),
         (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5) <= 1e-12))
      goto switchD_003dc365_caseD_4;
      uVar2 = uVar2 & 0xffe0 | 0x10;
    }
  }
  *(ushort *)&this->field_0x48 = uVar2 & 0xfc1f;
  uVar3 = uVar2 & 0x1f;
LAB_003dc5b1:
  return (uint)uVar3;
}

Assistant:

QTransform::TransformationType QTransform::type() const
{
    if (m_dirty == TxNone || m_dirty < m_type)
        return static_cast<TransformationType>(m_type);

    switch (static_cast<TransformationType>(m_dirty)) {
    case TxProject:
        if (!qFuzzyIsNull(m_matrix[0][2]) || !qFuzzyIsNull(m_matrix[1][2]) || !qFuzzyIsNull(m_matrix[2][2] - 1)) {
             m_type = TxProject;
             break;
        }
        Q_FALLTHROUGH();
    case TxShear:
    case TxRotate:
        if (!qFuzzyIsNull(m_matrix[0][1]) || !qFuzzyIsNull(m_matrix[1][0])) {
            const qreal dot = m_matrix[0][0] * m_matrix[1][0] + m_matrix[0][1] * m_matrix[1][1];
            if (qFuzzyIsNull(dot))
                m_type = TxRotate;
            else
                m_type = TxShear;
            break;
        }
        Q_FALLTHROUGH();
    case TxScale:
        if (!qFuzzyIsNull(m_matrix[0][0] - 1) || !qFuzzyIsNull(m_matrix[1][1] - 1)) {
            m_type = TxScale;
            break;
        }
        Q_FALLTHROUGH();
    case TxTranslate:
        if (!qFuzzyIsNull(m_matrix[2][0]) || !qFuzzyIsNull(m_matrix[2][1])) {
            m_type = TxTranslate;
            break;
        }
        Q_FALLTHROUGH();
    case TxNone:
        m_type = TxNone;
        break;
    }

    m_dirty = TxNone;
    return static_cast<TransformationType>(m_type);
}